

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,decimal_fp<double> *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  uint uVar1;
  char cVar2;
  numpunct *pnVar3;
  basic_appender<char> bVar4;
  ulong uVar5;
  undefined8 uVar6;
  int **ppiVar7;
  long lVar8;
  size_t sVar9;
  byte bVar10;
  int iVar11;
  ulong uVar12;
  undefined8 uVar13;
  uint uVar14;
  int iVar15;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  int exp;
  significand_type significand;
  anon_class_40_8_fd1bf2f9 write;
  int num_zeros;
  undefined1 local_da [2];
  bool local_d8 [4];
  int local_d4;
  undefined8 local_d0;
  undefined1 local_c8 [8];
  undefined1 local_c0 [20];
  undefined1 auStack_ac [20];
  format_specs *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  char *local_80;
  decimal_fp<double> *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int *local_60;
  long local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_c8 = (undefined1  [8])f->significand;
  lVar8 = 0x3f;
  if (((ulong)local_c8 | 1) != 0) {
    for (; ((ulong)local_c8 | 1) >> lVar8 == 0; lVar8 = lVar8 + -1) {
    }
  }
  local_d4 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar8] -
             (uint)((ulong)local_c8 <
                   (ulong)*(basic_specs *)
                           (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                           (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar8] * 8));
  uVar5 = (ulong)((local_d4 + 1) - (uint)(s == none));
  local_da[1] = '0';
  cVar2 = '.';
  local_d0._0_4_ = s;
  if (((specs->super_basic_specs).data_ & 0x4000) != 0) {
    local_78 = f;
    if (loc.locale_ == (void *)0x0) {
      std::locale::locale((locale *)local_c0);
    }
    else {
      std::locale::locale((locale *)local_c0,(locale *)loc.locale_);
    }
    pnVar3 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)local_c0);
    cVar2 = (**(code **)(*(long *)pnVar3 + 0x10))(pnVar3);
    std::locale::~locale((locale *)local_c0);
    f = local_78;
  }
  uVar6 = auStack_ac._4_8_;
  uVar14 = f->exponent;
  local_d0._4_4_ = local_d4 + uVar14;
  uVar1 = (specs->super_basic_specs).data_;
  iVar15 = specs->precision;
  bVar10 = (byte)uVar1 & 7;
  local_da[0] = cVar2;
  if (bVar10 != 1) {
    if ((uVar1 & 7) == 2) {
LAB_0013f33c:
      if ((int)uVar14 < 0) {
        if (local_d0._4_4_ < 1) {
          local_70._M_allocated_capacity._0_4_ = -local_d0._4_4_;
          if ((local_d4 == 0) &&
             (SBORROW4(iVar15,-local_d0._4_4_) != iVar15 + local_d0._4_4_ < 0 && -1 < iVar15)) {
            local_70._M_allocated_capacity._0_4_ = iVar15;
          }
          uVar14 = 1;
          if (local_d4 == 0 && local_70._M_allocated_capacity._0_4_ == 0) {
            uVar14 = uVar1 >> 0xd & 1;
          }
          local_c0._8_8_ = local_d8;
          local_d8[0] = (bool)(char)uVar14;
          sVar9 = (local_70._M_allocated_capacity._0_4_ + uVar14 + 1) + uVar5;
          local_c0._0_8_ = &local_d0;
          unique0x00004e80 = local_da;
          auStack_ac._4_8_ = &local_70;
          auStack_ac._12_8_ = local_da + 1;
          local_98 = (format_specs *)local_c8;
          local_90._M_allocated_capacity = (size_type)&local_d4;
          bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_&>
                            (out,specs,sVar9,sVar9,(anon_class_56_7_88befd79 *)local_c0);
          return (basic_appender<char>)bVar4.container;
        }
        uVar14 = iVar15 - local_d4 & (int)(uVar1 << 0x12) >> 0x1f;
        local_d8 = (bool  [4])uVar14;
        digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                  ((digit_grouping<char> *)local_c0,loc,(bool)((byte)(uVar1 >> 0xe) & 1));
        iVar15 = 0;
        if ((int)uVar14 < 1) {
          uVar14 = 0;
        }
        sVar9 = uVar14 + uVar5;
        ppiVar7 = (int **)local_c0._0_8_;
        do {
          iVar11 = 0x7fffffff;
          if (local_98 != (format_specs *)0x0) {
            if (ppiVar7 == (int **)(local_c0._8_8_ + local_c0._0_8_)) {
              uVar14 = (uint)(char)*(byte *)((long)(local_c0._8_8_ + local_c0._0_8_) + -1);
            }
            else {
              bVar10 = *(byte *)ppiVar7;
              if ((byte)(bVar10 + 0x81) < 0x82) goto LAB_0013f624;
              ppiVar7 = (int **)((long)ppiVar7 + 1);
              uVar14 = (uint)bVar10;
            }
            iVar15 = iVar15 + uVar14;
            iVar11 = iVar15;
          }
LAB_0013f624:
          sVar9 = sVar9 + 1;
        } while (iVar11 < local_d0._4_4_);
        local_70._M_allocated_capacity = (size_type)&local_d0;
        local_70._8_8_ = local_c8;
        local_60 = &local_d4;
        local_58 = (long)&local_d0 + 4;
        local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_da;
        local_40._M_allocated_capacity = (size_type)local_d8;
        local_40._8_8_ = local_da + 1;
        local_48 = (digit_grouping<char> *)local_c0;
        bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_&>
                          (out,specs,sVar9,sVar9,(anon_class_64_8_085c650e *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)auStack_ac._12_8_ != &local_90) {
          operator_delete((void *)auStack_ac._12_8_,(ulong)(local_90._M_allocated_capacity + 1));
        }
        uVar6 = stack0xffffffffffffff50;
        uVar13 = local_c0._0_8_;
        if ((undefined1 *)local_c0._0_8_ == local_c0 + 0x10) {
          return (basic_appender<char>)bVar4.container;
        }
      }
      else {
        lVar8 = uVar14 + uVar5;
        local_d8 = (bool  [4])(iVar15 - local_d0._4_4_);
        if ((uVar1 >> 0xd & 1) != 0) {
          if (bVar10 != 2 && (int)local_d8 < 1) {
            local_d8[0] = false;
            local_d8[1] = false;
            local_d8[2] = false;
            local_d8[3] = false;
          }
          lVar8 = lVar8 + 1;
          if (0 < (long)(int)local_d8) {
            lVar8 = lVar8 + (int)local_d8;
          }
        }
        digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                  ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar1 >> 0xe) & 1));
        sVar9 = lVar8 - 1;
        iVar15 = 0;
        uVar6 = local_70._M_allocated_capacity;
        do {
          iVar11 = 0x7fffffff;
          if (local_48 != (digit_grouping<char> *)0x0) {
            if ((int **)uVar6 == (int **)(local_70._8_8_ + local_70._M_allocated_capacity)) {
              uVar14 = (uint)(char)*(byte *)((long)(local_70._8_8_ + local_70._M_allocated_capacity)
                                            + -1);
            }
            else {
              bVar10 = *(byte *)uVar6;
              if ((byte)(bVar10 + 0x81) < 0x82) goto LAB_0013f4fb;
              uVar6 = uVar6 + 1;
              uVar14 = (uint)bVar10;
            }
            iVar15 = iVar15 + uVar14;
            iVar11 = iVar15;
          }
LAB_0013f4fb:
          sVar9 = sVar9 + 1;
        } while (iVar11 < local_d0._4_4_);
        local_c0._0_8_ = &local_d0;
        local_c0._8_8_ = local_c8;
        unique0x00004e80 = &local_d4;
        local_90._M_allocated_capacity = (size_type)local_da;
        local_90._8_8_ = local_d8;
        local_80 = local_da + 1;
        auStack_ac._4_8_ = f;
        auStack_ac._12_8_ = &local_70;
        local_98 = specs;
        bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_&>
                          (out,specs,sVar9,sVar9,(anon_class_72_9_eb40e20e *)local_c0);
        if (local_50 != &local_40) {
          operator_delete(local_50,(ulong)(local_40._M_allocated_capacity + 1));
        }
        uVar6 = local_60;
        uVar13 = local_70._M_allocated_capacity;
        if ((int **)local_70._M_allocated_capacity == &local_60) {
          return (basic_appender<char>)bVar4.container;
        }
      }
      operator_delete((void *)uVar13,uVar6 + 1);
      return (basic_appender<char>)bVar4.container;
    }
    if (-4 < local_d0._4_4_) {
      if (0 < iVar15) {
        exp_upper = iVar15;
      }
      if (local_d0._4_4_ <= exp_upper) goto LAB_0013f33c;
    }
  }
  iVar11 = local_d4 + uVar14 + -1;
  if ((uVar1 >> 0xd & 1) == 0) {
    uVar12 = 0;
    if (local_d4 == 1) {
      local_da[0] = '\0';
    }
  }
  else {
    uVar12 = 0;
    if (0 < iVar15 - local_d4) {
      uVar12 = (ulong)(uint)(iVar15 - local_d4);
    }
    uVar5 = uVar5 + uVar12;
  }
  iVar15 = 1 - local_d0._4_4_;
  if (0 < local_d0._4_4_) {
    iVar15 = iVar11;
  }
  lVar8 = 2;
  if (99 < iVar15) {
    lVar8 = (ulong)(999 < iVar15) + 3;
  }
  sVar9 = (3 - (ulong)(local_da[0] == '\0')) + lVar8 + uVar5;
  local_c0._0_4_ = (undefined4)local_d0;
  local_c0._8_8_ = local_c8;
  auStack_ac[0] = local_da[0];
  local_c0._16_4_ = local_d4;
  auStack_ac._4_5_ = CONCAT14('0',(int)uVar12);
  auStack_ac._10_2_ = SUB82(uVar6,6);
  auStack_ac._4_8_ =
       CONCAT26(auStack_ac._10_2_,CONCAT15(((uVar1 >> 0xc & 1) == 0) << 5,auStack_ac._4_5_)) |
       0x450000000000;
  auStack_ac._12_4_ = iVar11;
  if (specs->width < 1) {
    uVar5 = sVar9 + (out.container)->size_;
    if ((out.container)->capacity_ < uVar5) {
      (*(out.container)->grow_)(out.container,uVar5);
    }
    bVar4 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<double>,_fmt::v11::detail::digit_grouping<char>_>
            ::anon_class_40_8_fd1bf2f9::operator()
                      ((anon_class_40_8_fd1bf2f9 *)local_c0,out.container);
  }
  else {
    bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                      (out,specs,sVar9,sVar9,(anon_class_40_8_fd1bf2f9 *)local_c0);
  }
  return (basic_appender<char>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}